

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.h
# Opt level: O3

void __thiscall spvtools::opt::MergeReturnPass::MergeReturnPass(MergeReturnPass *this)

{
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__MergeReturnPass_00b0bc88;
  (this->state_).
  super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state_).
  super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state_).
  super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->function_ = (Function *)0x0;
  this->return_flag_ = (Instruction *)0x0;
  this->return_value_ = (Instruction *)0x0;
  this->constant_true_ = (Instruction *)0x0;
  this->final_return_block_ = (BasicBlock *)0x0;
  (this->original_dominator_)._M_h._M_buckets = &(this->original_dominator_)._M_h._M_single_bucket;
  (this->original_dominator_)._M_h._M_bucket_count = 1;
  (this->original_dominator_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->original_dominator_)._M_h._M_element_count = 0;
  (this->original_dominator_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->original_dominator_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->original_dominator_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->new_edges_)._M_h._M_buckets = &(this->new_edges_)._M_h._M_single_bucket;
  (this->new_edges_)._M_h._M_bucket_count = 1;
  (this->new_edges_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->new_edges_)._M_h._M_element_count = 0;
  (this->new_edges_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->new_edges_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->new_edges_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->return_blocks_)._M_h._M_buckets = &(this->return_blocks_)._M_h._M_single_bucket;
  (this->return_blocks_)._M_h._M_bucket_count = 1;
  (this->return_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->return_blocks_)._M_h._M_element_count = 0;
  (this->return_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->return_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->return_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MergeReturnPass()
      : function_(nullptr),
        return_flag_(nullptr),
        return_value_(nullptr),
        constant_true_(nullptr),
        final_return_block_(nullptr) {}